

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

uchar * do_png(png *p,int *x,int *y,int *n,int req_comp)

{
  int iVar1;
  png *local_40;
  uchar *result;
  int req_comp_local;
  int *n_local;
  int *y_local;
  int *x_local;
  png *p_local;
  
  local_40 = (png *)0x0;
  p->expanded = (uint8 *)0x0;
  p->idata = (uint8 *)0x0;
  p->out = (uint8 *)0x0;
  if ((req_comp < 0) || (4 < req_comp)) {
    e("Internal error");
    p_local = (png *)0x0;
  }
  else {
    iVar1 = parse_png_file(p,0,req_comp);
    if (iVar1 != 0) {
      local_40 = (png *)p->out;
      p->out = (uint8 *)0x0;
      if ((req_comp != 0) && (req_comp != (p->s).img_out_n)) {
        local_40 = (png *)convert_format((uchar *)local_40,(p->s).img_out_n,req_comp,(p->s).img_x,
                                         (p->s).img_y);
        (p->s).img_out_n = req_comp;
        if (local_40 == (png *)0x0) {
          return (uchar *)0x0;
        }
      }
      *x = (p->s).img_x;
      *y = (p->s).img_y;
      if (n != (int *)0x0) {
        *n = (p->s).img_n;
      }
    }
    free(p->out);
    p->out = (uint8 *)0x0;
    free(p->expanded);
    p->expanded = (uint8 *)0x0;
    free(p->idata);
    p->idata = (uint8 *)0x0;
    p_local = local_40;
  }
  return (uchar *)p_local;
}

Assistant:

static unsigned char *do_png(png *p, int *x, int *y, int *n, int req_comp)
{
   unsigned char *result=NULL;
   p->expanded = NULL;
   p->idata = NULL;
   p->out = NULL;
   if (req_comp < 0 || req_comp > 4) return epuc("bad req_comp", "Internal error");
   if (parse_png_file(p, SCAN_load, req_comp)) {
      result = p->out;
      p->out = NULL;
      if (req_comp && req_comp != p->s.img_out_n) {
         result = convert_format(result, p->s.img_out_n, req_comp, p->s.img_x, p->s.img_y);
         p->s.img_out_n = req_comp;
         if (result == NULL) return result;
      }
      *x = p->s.img_x;
      *y = p->s.img_y;
      if (n) *n = p->s.img_n;
   }
   free(p->out);      p->out      = NULL;
   free(p->expanded); p->expanded = NULL;
   free(p->idata);    p->idata    = NULL;

   return result;
}